

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O1

void __thiscall
psy::C::Parser::DiagnosticsReporter::AmbiguousCastOrBinaryExpression
          (DiagnosticsReporter *this,AmbiguousCastOrBinaryExpressionSyntax *node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  SyntaxToken *this_00;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  string s;
  long *local_138;
  long local_128;
  long lStack_120;
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  DiagnosticDescriptor local_b8;
  string local_50;
  
  this_00 = peek(this->parser_,1);
  SyntaxToken::valueText_abi_cxx11_(&local_50,this_00);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x46fc07);
  paVar1 = &local_b8.id_.field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_b8.id_.field_2._M_allocated_capacity = *psVar4;
    local_b8.id_.field_2._8_8_ = plVar3[3];
    local_b8.id_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b8.id_.field_2._M_allocated_capacity = *psVar4;
    local_b8.id_._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_b8.id_._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_128 = *plVar5;
    lStack_120 = plVar3[3];
    local_138 = &local_128;
  }
  else {
    local_128 = *plVar5;
    local_138 = (long *)*plVar3;
  }
  lVar2 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.id_._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8.id_._M_dataplus._M_p,local_b8.id_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_118,ID_of_AmbiguousCastOrBinaryExpression_abi_cxx11_._M_dataplus._M_p,
             ID_of_AmbiguousCastOrBinaryExpression_abi_cxx11_._M_dataplus._M_p +
             ID_of_AmbiguousCastOrBinaryExpression_abi_cxx11_._M_string_length);
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"[[ambiguous cast or binary expression]]","");
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char*>((string *)local_f8,local_138,lVar2 + (long)local_138);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_b8,local_118,local_d8,local_f8,2,1);
  retainAmbiguityDiagnostic(this,&local_b8,(SyntaxNode *)node);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.description_._M_dataplus._M_p != &local_b8.description_.field_2) {
    operator_delete(local_b8.description_._M_dataplus._M_p,
                    local_b8.description_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.title_._M_dataplus._M_p != &local_b8.title_.field_2) {
    operator_delete(local_b8.title_._M_dataplus._M_p,
                    local_b8.title_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.id_._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8.id_._M_dataplus._M_p,local_b8.id_.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128 + 1);
  }
  return;
}

Assistant:

void Parser::DiagnosticsReporter::AmbiguousCastOrBinaryExpression(
        const AmbiguousCastOrBinaryExpressionSyntax* node)
{
    std::string s = "ambiguous cast or binary expression `"
            + parser_->peek().valueText()
            + "'";

    retainAmbiguityDiagnostic(
                DiagnosticDescriptor(ID_of_AmbiguousCastOrBinaryExpression,
                                     "[[ambiguous cast or binary expression]]",
                                     s,
                                     DiagnosticSeverity::Error,
                                     DiagnosticCategory::Syntax),
                node);
}